

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusion<unsigned_short>::mulSaturationWeight
          (HighDynamicRangeFusion<unsigned_short> *this,ImageFloat *wp,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,float max_value)

{
  long lVar1;
  float fVar2;
  store_t_conflict1 sVar3;
  long lVar4;
  float *pfVar5;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  float in_XMM0_Da;
  double dVar6;
  float v;
  int d;
  float mean;
  float ssum;
  long i;
  long k;
  float *p;
  int n;
  float scale;
  float local_58;
  float local_54;
  float local_50;
  int local_4c;
  float local_48;
  float local_44;
  long local_40;
  long local_38;
  float *local_30;
  int local_24;
  float local_20;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_18;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  
  local_20 = 1.0 / in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_24 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(in_RDX);
  local_30 = Image<float,_gimage::PixelTraits<float>_>::getPtr(local_10,0,0,0);
  local_38 = 0;
  while( true ) {
    lVar1 = local_38;
    lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_18);
    if (lVar4 <= lVar1) break;
    local_40 = 0;
    while( true ) {
      lVar1 = local_40;
      lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_18);
      if (lVar4 <= lVar1) break;
      local_44 = 0.0;
      local_48 = 0.0;
      for (local_4c = 0; fVar2 = local_20, local_4c < local_24; local_4c = local_4c + 1) {
        sVar3 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                          (local_18,local_40,local_38,local_4c);
        local_50 = fVar2 * (float)sVar3;
        local_44 = local_50 * local_50 + local_44;
        local_48 = local_50 + local_48;
      }
      local_48 = local_48 / (float)local_24;
      local_54 = 0.0;
      local_58 = (-((float)local_24 * local_48) * local_48 + local_44) / (float)local_24;
      pfVar5 = std::max<float>(&local_54,&local_58);
      dVar6 = std::sqrt((double)(ulong)(uint)*pfVar5);
      *local_30 = SUB84(dVar6,0) * *local_30;
      local_40 = local_40 + 1;
      local_30 = local_30 + 1;
    }
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

void mulSaturationWeight(ImageFloat &wp, const Image<T> &image, float max_value)
    {
      float scale=1.0f/max_value;
      int n=image.getDepth();

      float *p=wp.getPtr(0, 0, 0);
      for (long k=0; k<image.getHeight(); k++)
      {
        for (long i=0; i<image.getWidth(); i++)
        {
          float ssum=0;
          float mean=0;

          for (int d=0; d<n; d++)
          {
            float v=scale*image.get(i, k, d);
            ssum+=v*v;
            mean+=v;
          }

          mean/=n;

          // multiply standard deviation of color values

          *p++ *= static_cast<float>(std::sqrt(std::max(0.0f, (ssum-n*mean*mean)/n)));
        }
      }
    }